

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::sse42::
     BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::QuadMvIntersectorKMoeller<4,_4,_false>_>,_true>
     ::occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  BVH *bvh;
  Geometry *pGVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  vfloat<4> vVar10;
  bool bVar11;
  uint uVar12;
  undefined4 uVar13;
  ulong uVar14;
  size_t sVar15;
  size_t sVar16;
  int iVar17;
  RTCIntersectArguments *pRVar18;
  ulong uVar19;
  size_t sVar20;
  long lVar21;
  ulong uVar22;
  NodeRef root;
  long lVar23;
  Ref<embree::Geometry> *pRVar24;
  NodeRef *pNVar25;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar26;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar27;
  float fVar28;
  float fVar40;
  float fVar41;
  vint4 bi_1;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  float fVar42;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  uint uVar43;
  float fVar44;
  float fVar45;
  uint uVar50;
  float fVar53;
  vint4 bi;
  float fVar51;
  float fVar52;
  float fVar54;
  float fVar55;
  float fVar56;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  float fVar57;
  float fVar58;
  float fVar59;
  vint4 ai;
  float fVar60;
  float fVar61;
  float fVar64;
  float fVar65;
  vint4 ai_1;
  undefined1 auVar62 [16];
  float fVar66;
  undefined1 auVar63 [16];
  float fVar67;
  float fVar70;
  float fVar71;
  vint4 ai_3;
  undefined1 auVar68 [16];
  float fVar72;
  undefined1 auVar69 [16];
  uint uVar75;
  uint uVar76;
  vint4 bi_2;
  undefined1 auVar73 [16];
  uint uVar77;
  undefined1 auVar74 [16];
  float fVar78;
  float fVar79;
  float fVar82;
  float fVar83;
  vint4 bi_3;
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  float fVar84;
  uint uVar85;
  float fVar86;
  uint uVar87;
  float fVar88;
  uint uVar89;
  float fVar90;
  vint4 ai_2;
  uint uVar91;
  float fVar92;
  float fVar93;
  float fVar94;
  float fVar97;
  float fVar98;
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  float fVar99;
  float fVar100;
  float fVar101;
  float fVar102;
  float fVar103;
  float fVar104;
  float fVar105;
  float fVar106;
  float fVar107;
  float fVar108;
  float fVar109;
  float fVar110;
  float fVar111;
  float fVar112;
  float fVar113;
  float fVar114;
  float fVar115;
  float fVar116;
  uint uVar117;
  uint uVar118;
  uint uVar119;
  uint uVar120;
  uint uVar121;
  Precalculations pre;
  float local_1968;
  float fStack_1964;
  float fStack_1960;
  float fStack_195c;
  vbool<4> terminated;
  undefined1 local_1918 [16];
  float local_1908;
  float fStack_1904;
  float fStack_1900;
  float fStack_18fc;
  uint local_18b8;
  uint uStack_18b4;
  uint uStack_18b0;
  uint uStack_18ac;
  float local_18a8;
  float fStack_18a4;
  float fStack_18a0;
  float fStack_189c;
  float local_1898;
  float fStack_1894;
  float fStack_1890;
  float fStack_188c;
  float local_1888;
  float fStack_1884;
  float fStack_1880;
  float fStack_187c;
  float local_1878;
  float fStack_1874;
  float fStack_1870;
  float fStack_186c;
  float local_1868;
  float fStack_1864;
  float fStack_1860;
  float fStack_185c;
  float local_1858;
  float fStack_1854;
  float fStack_1850;
  float fStack_184c;
  float local_1848;
  float fStack_1844;
  float fStack_1840;
  float fStack_183c;
  TravRayK<4,_false> tray;
  NodeRef stack_node [241];
  vfloat<4> stack_near [241];
  undefined1 auVar46 [16];
  
  bvh = (BVH *)This->ptr;
  sVar15 = (bvh->root).ptr;
  if (sVar15 != 8) {
    pRVar18 = (RTCIntersectArguments *)ray;
    if ((context->user != (RTCRayQueryContext *)0x0) &&
       (pRVar18 = context->args,
       (pRVar18->flags & RTC_RAY_QUERY_FLAG_COHERENT) != RTC_RAY_QUERY_FLAG_INCOHERENT)) {
      occludedCoherent(valid_i,This,ray,context);
      return;
    }
    auVar62 = *(undefined1 (*) [16])(ray + 0x80);
    auVar68._0_12_ = ZEXT812(0);
    auVar68._12_4_ = 0;
    uVar43 = -(uint)((valid_i->field_0).i[0] == -1 && 0.0 <= auVar62._0_4_);
    uVar50 = -(uint)((valid_i->field_0).i[1] == -1 && 0.0 <= auVar62._4_4_);
    auVar46._0_8_ = CONCAT44(uVar50,uVar43);
    auVar46._8_4_ = -(uint)((valid_i->field_0).i[2] == -1 && 0.0 <= auVar62._8_4_);
    auVar46._12_4_ = -(uint)((valid_i->field_0).i[3] == -1 && 0.0 <= auVar62._12_4_);
    iVar17 = movmskps((int)pRVar18,auVar46);
    if (iVar17 != 0) {
      tray.org.field_0._0_8_ = *(undefined8 *)ray;
      tray.org.field_0._8_8_ = *(undefined8 *)(ray + 8);
      tray.org.field_0._16_8_ = *(undefined8 *)(ray + 0x10);
      tray.org.field_0._24_8_ = *(undefined8 *)(ray + 0x18);
      tray.org.field_0._32_8_ = *(undefined8 *)(ray + 0x20);
      tray.org.field_0._40_8_ = *(undefined8 *)(ray + 0x28);
      tray.dir.field_0.field_0.x.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x40);
      tray.dir.field_0.field_0.y.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x50);
      tray.dir.field_0.field_0.z.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x60);
      fVar44 = (float)DAT_01f4bd50;
      fVar51 = DAT_01f4bd50._4_4_;
      fVar53 = DAT_01f4bd50._8_4_;
      fVar55 = DAT_01f4bd50._12_4_;
      auVar30._4_4_ = -(uint)(ABS(tray.dir.field_0._4_4_) < fVar51);
      auVar30._0_4_ = -(uint)(ABS(tray.dir.field_0._0_4_) < fVar44);
      auVar30._8_4_ = -(uint)(ABS(tray.dir.field_0._8_4_) < fVar53);
      auVar30._12_4_ = -(uint)(ABS(tray.dir.field_0._12_4_) < fVar55);
      auVar95 = blendvps((undefined1  [16])tray.dir.field_0.field_0.x.field_0,_DAT_01f4bd50,auVar30)
      ;
      auVar73._4_4_ = -(uint)(ABS(tray.dir.field_0._20_4_) < fVar51);
      auVar73._0_4_ = -(uint)(ABS(tray.dir.field_0._16_4_) < fVar44);
      auVar73._8_4_ = -(uint)(ABS(tray.dir.field_0._24_4_) < fVar53);
      auVar73._12_4_ = -(uint)(ABS(tray.dir.field_0._28_4_) < fVar55);
      auVar80 = blendvps((undefined1  [16])tray.dir.field_0.field_0.y.field_0,_DAT_01f4bd50,auVar73)
      ;
      auVar29._4_4_ = -(uint)(ABS(tray.dir.field_0._36_4_) < fVar51);
      auVar29._0_4_ = -(uint)(ABS(tray.dir.field_0._32_4_) < fVar44);
      auVar29._8_4_ = -(uint)(ABS(tray.dir.field_0._40_4_) < fVar53);
      auVar29._12_4_ = -(uint)(ABS(tray.dir.field_0._44_4_) < fVar55);
      auVar73 = blendvps((undefined1  [16])tray.dir.field_0.field_0.z.field_0,_DAT_01f4bd50,auVar29)
      ;
      auVar30 = rcpps(auVar29,auVar95);
      fVar44 = auVar30._0_4_;
      auVar96._0_4_ = auVar95._0_4_ * fVar44;
      fVar51 = auVar30._4_4_;
      auVar96._4_4_ = auVar95._4_4_ * fVar51;
      fVar53 = auVar30._8_4_;
      auVar96._8_4_ = auVar95._8_4_ * fVar53;
      fVar55 = auVar30._12_4_;
      auVar96._12_4_ = auVar95._12_4_ * fVar55;
      tray.rdir.field_0._0_4_ = (1.0 - auVar96._0_4_) * fVar44 + fVar44;
      tray.rdir.field_0._4_4_ = (1.0 - auVar96._4_4_) * fVar51 + fVar51;
      tray.rdir.field_0._8_4_ = (1.0 - auVar96._8_4_) * fVar53 + fVar53;
      tray.rdir.field_0._12_4_ = (1.0 - auVar96._12_4_) * fVar55 + fVar55;
      auVar30 = rcpps(auVar96,auVar80);
      fVar44 = auVar30._0_4_;
      auVar81._0_4_ = auVar80._0_4_ * fVar44;
      fVar51 = auVar30._4_4_;
      auVar81._4_4_ = auVar80._4_4_ * fVar51;
      fVar53 = auVar30._8_4_;
      auVar81._8_4_ = auVar80._8_4_ * fVar53;
      fVar55 = auVar30._12_4_;
      auVar81._12_4_ = auVar80._12_4_ * fVar55;
      tray.rdir.field_0._16_4_ = (1.0 - auVar81._0_4_) * fVar44 + fVar44;
      tray.rdir.field_0._20_4_ = (1.0 - auVar81._4_4_) * fVar51 + fVar51;
      tray.rdir.field_0._24_4_ = (1.0 - auVar81._8_4_) * fVar53 + fVar53;
      tray.rdir.field_0._28_4_ = (1.0 - auVar81._12_4_) * fVar55 + fVar55;
      auVar30 = rcpps(auVar81,auVar73);
      fVar44 = auVar30._0_4_;
      fVar51 = auVar30._4_4_;
      fVar53 = auVar30._8_4_;
      fVar55 = auVar30._12_4_;
      tray.rdir.field_0._32_4_ = (1.0 - auVar73._0_4_ * fVar44) * fVar44 + fVar44;
      tray.rdir.field_0._36_4_ = (1.0 - auVar73._4_4_ * fVar51) * fVar51 + fVar51;
      tray.rdir.field_0._40_4_ = (1.0 - auVar73._8_4_ * fVar53) * fVar53 + fVar53;
      tray.rdir.field_0._44_4_ = (1.0 - auVar73._12_4_ * fVar55) * fVar55 + fVar55;
      tray.nearXYZ.field_0._0_4_ = -(uint)((float)tray.rdir.field_0._0_4_ < 0.0) & 0x10;
      tray.nearXYZ.field_0._4_4_ = -(uint)((float)tray.rdir.field_0._4_4_ < 0.0) & 0x10;
      tray.nearXYZ.field_0._8_4_ = -(uint)((float)tray.rdir.field_0._8_4_ < 0.0) & 0x10;
      tray.nearXYZ.field_0._12_4_ = -(uint)((float)tray.rdir.field_0._12_4_ < 0.0) & 0x10;
      auVar80._4_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._20_4_);
      auVar80._0_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._16_4_);
      auVar80._8_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._24_4_);
      auVar80._12_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._28_4_);
      tray.nearXYZ.field_0.field_0.y.field_0 =
           (vint_impl<4>)blendvps(_DAT_01f79fd0,_DAT_01f57210,auVar80);
      auVar95._4_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._36_4_);
      auVar95._0_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._32_4_);
      auVar95._8_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._40_4_);
      auVar95._12_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._44_4_);
      tray.nearXYZ.field_0.field_0.z.field_0 =
           (vint_impl<4>)blendvps(_DAT_01f79ff0,_DAT_01f79fe0,auVar95);
      auVar30 = maxps(*(undefined1 (*) [16])(ray + 0x30),auVar68);
      auVar62 = maxps(auVar62,auVar68);
      fVar44 = (float)DAT_01f45a30;
      fVar51 = DAT_01f45a30._4_4_;
      fVar53 = DAT_01f45a30._8_4_;
      fVar55 = DAT_01f45a30._12_4_;
      tray.tnear.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
           blendvps((undefined1  [16])_DAT_01f45a30,auVar30,auVar46);
      tray.tfar.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)blendvps(_DAT_01f45a40,auVar62,auVar46);
      terminated.field_0._0_8_ = auVar46._0_8_ ^ 0xffffffffffffffff;
      terminated.field_0.i[2] = auVar46._8_4_ ^ 0xffffffff;
      terminated.field_0.i[3] = auVar46._12_4_ ^ 0xffffffff;
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar19 = 3;
        sVar16 = 0;
      }
      else {
        sVar16 = CONCAT71((int7)((ulong)context->args >> 8),
                          *(byte *)((long)&context->args->flags + 2)) & 0xffffffffffffff01;
        uVar19 = (ulong)((char)sVar16 == '\0') + 2;
      }
      pNVar25 = stack_node + 2;
      stack_node[0].ptr = 0xfffffffffffffff8;
      stack_near[0].field_0 = _DAT_01f45a30;
      stack_node[1].ptr = sVar15;
      stack_near[1].field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)tray.tnear;
      paVar26 = &stack_near[2].field_0;
LAB_006c813c:
      do {
        do {
          root.ptr = pNVar25[-1].ptr;
          if (root.ptr == 0xfffffffffffffff8) goto LAB_006c8bb2;
          pNVar25 = pNVar25 + -1;
          paVar27 = paVar26 + -1;
          local_1968 = paVar27->v[0];
          fStack_1964 = *(float *)((long)paVar26 + -0xc);
          fStack_1960 = *(float *)((long)paVar26 + -8);
          fStack_195c = *(float *)((long)paVar26 + -4);
          vVar10.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar27->v;
          auVar62._4_4_ = -(uint)(fStack_1964 < tray.tfar.field_0.v[1]);
          auVar62._0_4_ = -(uint)(local_1968 < tray.tfar.field_0.v[0]);
          auVar62._8_4_ = -(uint)(fStack_1960 < tray.tfar.field_0.v[2]);
          auVar62._12_4_ = -(uint)(fStack_195c < tray.tfar.field_0.v[3]);
          uVar12 = movmskps((int)sVar15,auVar62);
          sVar15 = (size_t)uVar12;
          paVar26 = paVar27;
        } while (uVar12 == 0);
        uVar22 = (ulong)(byte)uVar12;
        uVar14 = (ulong)(uint)POPCOUNT(uVar12 & 0xff);
        sVar15 = uVar14;
        if (uVar19 < uVar14) {
LAB_006c8180:
          do {
            if ((root.ptr & 8) != 0) {
              if (root.ptr == 0xfffffffffffffff8) goto LAB_006c8bb2;
              auVar33._4_4_ = -(uint)(fStack_1964 < tray.tfar.field_0.v[1]);
              auVar33._0_4_ = -(uint)(local_1968 < tray.tfar.field_0.v[0]);
              auVar33._8_4_ = -(uint)(fStack_1960 < tray.tfar.field_0.v[2]);
              auVar33._12_4_ = -(uint)(fStack_195c < tray.tfar.field_0.v[3]);
              uVar12 = movmskps((int)sVar15,auVar33);
              sVar15 = (size_t)uVar12;
              paVar26 = paVar27;
              if (uVar12 == 0) goto LAB_006c813c;
              sVar15 = (ulong)((uint)root.ptr & 0xf) - 8;
              local_1918._0_8_ = terminated.field_0._0_8_ ^ 0xffffffffffffffff;
              local_1918._8_4_ = terminated.field_0._8_4_ ^ 0xffffffff;
              local_1918._12_4_ = terminated.field_0._12_4_ ^ 0xffffffff;
              lVar23 = (root.ptr & 0xfffffffffffffff0) + 0xc0;
              sVar16 = 0;
              goto LAB_006c83fa;
            }
            sVar20 = 8;
            local_1968 = fVar44;
            fStack_1964 = fVar51;
            fStack_1960 = fVar53;
            fStack_195c = fVar55;
            for (sVar16 = 0;
                (sVar16 != 4 &&
                (sVar15 = *(size_t *)((root.ptr & 0xfffffffffffffff0) + sVar16 * 8), sVar15 != 8));
                sVar16 = sVar16 + 1) {
              fVar84 = *(float *)(root.ptr + 0x20 + sVar16 * 4);
              fVar28 = *(float *)(root.ptr + 0x30 + sVar16 * 4);
              fVar40 = *(float *)(root.ptr + 0x40 + sVar16 * 4);
              fVar42 = *(float *)(root.ptr + 0x50 + sVar16 * 4);
              fVar57 = (fVar84 - (float)tray.org.field_0._0_4_) * (float)tray.rdir.field_0._0_4_;
              fVar58 = (fVar84 - (float)tray.org.field_0._4_4_) * (float)tray.rdir.field_0._4_4_;
              fVar59 = (fVar84 - (float)tray.org.field_0._8_4_) * (float)tray.rdir.field_0._8_4_;
              fVar60 = (fVar84 - (float)tray.org.field_0._12_4_) * (float)tray.rdir.field_0._12_4_;
              fVar61 = (fVar40 - (float)tray.org.field_0._16_4_) * (float)tray.rdir.field_0._16_4_;
              fVar64 = (fVar40 - (float)tray.org.field_0._20_4_) * (float)tray.rdir.field_0._20_4_;
              fVar65 = (fVar40 - (float)tray.org.field_0._24_4_) * (float)tray.rdir.field_0._24_4_;
              fVar66 = (fVar40 - (float)tray.org.field_0._28_4_) * (float)tray.rdir.field_0._28_4_;
              fVar84 = *(float *)(root.ptr + 0x60 + sVar16 * 4);
              fVar67 = (fVar84 - (float)tray.org.field_0._32_4_) * (float)tray.rdir.field_0._32_4_;
              fVar70 = (fVar84 - (float)tray.org.field_0._36_4_) * (float)tray.rdir.field_0._36_4_;
              fVar71 = (fVar84 - (float)tray.org.field_0._40_4_) * (float)tray.rdir.field_0._40_4_;
              fVar72 = (fVar84 - (float)tray.org.field_0._44_4_) * (float)tray.rdir.field_0._44_4_;
              fVar45 = (fVar28 - (float)tray.org.field_0._0_4_) * (float)tray.rdir.field_0._0_4_;
              fVar52 = (fVar28 - (float)tray.org.field_0._4_4_) * (float)tray.rdir.field_0._4_4_;
              fVar54 = (fVar28 - (float)tray.org.field_0._8_4_) * (float)tray.rdir.field_0._8_4_;
              fVar56 = (fVar28 - (float)tray.org.field_0._12_4_) * (float)tray.rdir.field_0._12_4_;
              fVar28 = (fVar42 - (float)tray.org.field_0._16_4_) * (float)tray.rdir.field_0._16_4_;
              fVar40 = (fVar42 - (float)tray.org.field_0._20_4_) * (float)tray.rdir.field_0._20_4_;
              fVar41 = (fVar42 - (float)tray.org.field_0._24_4_) * (float)tray.rdir.field_0._24_4_;
              fVar42 = (fVar42 - (float)tray.org.field_0._28_4_) * (float)tray.rdir.field_0._28_4_;
              fVar84 = *(float *)(root.ptr + 0x70 + sVar16 * 4);
              fVar78 = (fVar84 - (float)tray.org.field_0._32_4_) * (float)tray.rdir.field_0._32_4_;
              fVar82 = (fVar84 - (float)tray.org.field_0._36_4_) * (float)tray.rdir.field_0._36_4_;
              fVar83 = (fVar84 - (float)tray.org.field_0._40_4_) * (float)tray.rdir.field_0._40_4_;
              fVar84 = (fVar84 - (float)tray.org.field_0._44_4_) * (float)tray.rdir.field_0._44_4_;
              uVar12 = (uint)((int)fVar45 < (int)fVar57) * (int)fVar45 |
                       (uint)((int)fVar45 >= (int)fVar57) * (int)fVar57;
              uVar75 = (uint)((int)fVar52 < (int)fVar58) * (int)fVar52 |
                       (uint)((int)fVar52 >= (int)fVar58) * (int)fVar58;
              uVar76 = (uint)((int)fVar54 < (int)fVar59) * (int)fVar54 |
                       (uint)((int)fVar54 >= (int)fVar59) * (int)fVar59;
              uVar77 = (uint)((int)fVar56 < (int)fVar60) * (int)fVar56 |
                       (uint)((int)fVar56 >= (int)fVar60) * (int)fVar60;
              uVar85 = (uint)((int)fVar28 < (int)fVar61) * (int)fVar28 |
                       (uint)((int)fVar28 >= (int)fVar61) * (int)fVar61;
              uVar87 = (uint)((int)fVar40 < (int)fVar64) * (int)fVar40 |
                       (uint)((int)fVar40 >= (int)fVar64) * (int)fVar64;
              uVar89 = (uint)((int)fVar41 < (int)fVar65) * (int)fVar41 |
                       (uint)((int)fVar41 >= (int)fVar65) * (int)fVar65;
              uVar91 = (uint)((int)fVar42 < (int)fVar66) * (int)fVar42 |
                       (uint)((int)fVar42 >= (int)fVar66) * (int)fVar66;
              uVar85 = ((int)uVar85 < (int)uVar12) * uVar12 | ((int)uVar85 >= (int)uVar12) * uVar85;
              uVar87 = ((int)uVar87 < (int)uVar75) * uVar75 | ((int)uVar87 >= (int)uVar75) * uVar87;
              uVar89 = ((int)uVar89 < (int)uVar76) * uVar76 | ((int)uVar89 >= (int)uVar76) * uVar89;
              uVar91 = ((int)uVar91 < (int)uVar77) * uVar77 | ((int)uVar91 >= (int)uVar77) * uVar91;
              uVar12 = (uint)((int)fVar78 < (int)fVar67) * (int)fVar78 |
                       (uint)((int)fVar78 >= (int)fVar67) * (int)fVar67;
              uVar75 = (uint)((int)fVar82 < (int)fVar70) * (int)fVar82 |
                       (uint)((int)fVar82 >= (int)fVar70) * (int)fVar70;
              uVar76 = (uint)((int)fVar83 < (int)fVar71) * (int)fVar83 |
                       (uint)((int)fVar83 >= (int)fVar71) * (int)fVar71;
              uVar77 = (uint)((int)fVar84 < (int)fVar72) * (int)fVar84 |
                       (uint)((int)fVar84 >= (int)fVar72) * (int)fVar72;
              auVar74._0_4_ =
                   ((int)uVar12 < (int)uVar85) * uVar85 | ((int)uVar12 >= (int)uVar85) * uVar12;
              auVar74._4_4_ =
                   ((int)uVar75 < (int)uVar87) * uVar87 | ((int)uVar75 >= (int)uVar87) * uVar75;
              auVar74._8_4_ =
                   ((int)uVar76 < (int)uVar89) * uVar89 | ((int)uVar76 >= (int)uVar89) * uVar76;
              auVar74._12_4_ =
                   ((int)uVar77 < (int)uVar91) * uVar91 | ((int)uVar77 >= (int)uVar91) * uVar77;
              uVar85 = (uint)((int)fVar45 < (int)fVar57) * (int)fVar57 |
                       (uint)((int)fVar45 >= (int)fVar57) * (int)fVar45;
              uVar87 = (uint)((int)fVar52 < (int)fVar58) * (int)fVar58 |
                       (uint)((int)fVar52 >= (int)fVar58) * (int)fVar52;
              uVar89 = (uint)((int)fVar54 < (int)fVar59) * (int)fVar59 |
                       (uint)((int)fVar54 >= (int)fVar59) * (int)fVar54;
              uVar91 = (uint)((int)fVar56 < (int)fVar60) * (int)fVar60 |
                       (uint)((int)fVar56 >= (int)fVar60) * (int)fVar56;
              uVar12 = (uint)((int)fVar28 < (int)fVar61) * (int)fVar61 |
                       (uint)((int)fVar28 >= (int)fVar61) * (int)fVar28;
              uVar75 = (uint)((int)fVar40 < (int)fVar64) * (int)fVar64 |
                       (uint)((int)fVar40 >= (int)fVar64) * (int)fVar40;
              uVar76 = (uint)((int)fVar41 < (int)fVar65) * (int)fVar65 |
                       (uint)((int)fVar41 >= (int)fVar65) * (int)fVar41;
              uVar77 = (uint)((int)fVar42 < (int)fVar66) * (int)fVar66 |
                       (uint)((int)fVar42 >= (int)fVar66) * (int)fVar42;
              uVar12 = ((int)uVar85 < (int)uVar12) * uVar85 | ((int)uVar85 >= (int)uVar12) * uVar12;
              uVar75 = ((int)uVar87 < (int)uVar75) * uVar87 | ((int)uVar87 >= (int)uVar75) * uVar75;
              uVar76 = ((int)uVar89 < (int)uVar76) * uVar89 | ((int)uVar89 >= (int)uVar76) * uVar76;
              uVar77 = ((int)uVar91 < (int)uVar77) * uVar91 | ((int)uVar91 >= (int)uVar77) * uVar77;
              uVar85 = (uint)((int)fVar78 < (int)fVar67) * (int)fVar67 |
                       (uint)((int)fVar78 >= (int)fVar67) * (int)fVar78;
              uVar87 = (uint)((int)fVar82 < (int)fVar70) * (int)fVar70 |
                       (uint)((int)fVar82 >= (int)fVar70) * (int)fVar82;
              uVar89 = (uint)((int)fVar83 < (int)fVar71) * (int)fVar71 |
                       (uint)((int)fVar83 >= (int)fVar71) * (int)fVar83;
              uVar91 = (uint)((int)fVar84 < (int)fVar72) * (int)fVar72 |
                       (uint)((int)fVar84 >= (int)fVar72) * (int)fVar84;
              uVar12 = ((int)uVar12 < (int)uVar85) * uVar12 | ((int)uVar12 >= (int)uVar85) * uVar85;
              uVar75 = ((int)uVar75 < (int)uVar87) * uVar75 | ((int)uVar75 >= (int)uVar87) * uVar87;
              uVar76 = ((int)uVar76 < (int)uVar89) * uVar76 | ((int)uVar76 >= (int)uVar89) * uVar89;
              uVar77 = ((int)uVar77 < (int)uVar91) * uVar77 | ((int)uVar77 >= (int)uVar91) * uVar91;
              auVar31._4_4_ =
                   -(uint)((float)((tray.tnear.field_0.i[1] < (int)auVar74._4_4_) * auVar74._4_4_ |
                                  (uint)(tray.tnear.field_0.i[1] >= (int)auVar74._4_4_) *
                                  tray.tnear.field_0.i[1]) <=
                          (float)((uint)(tray.tfar.field_0.i[1] < (int)uVar75) *
                                  tray.tfar.field_0.i[1] |
                                 (tray.tfar.field_0.i[1] >= (int)uVar75) * uVar75));
              auVar31._0_4_ =
                   -(uint)((float)((tray.tnear.field_0.i[0] < (int)auVar74._0_4_) * auVar74._0_4_ |
                                  (uint)(tray.tnear.field_0.i[0] >= (int)auVar74._0_4_) *
                                  tray.tnear.field_0.i[0]) <=
                          (float)((uint)(tray.tfar.field_0.i[0] < (int)uVar12) *
                                  tray.tfar.field_0.i[0] |
                                 (tray.tfar.field_0.i[0] >= (int)uVar12) * uVar12));
              auVar31._8_4_ =
                   -(uint)((float)((tray.tnear.field_0.i[2] < (int)auVar74._8_4_) * auVar74._8_4_ |
                                  (uint)(tray.tnear.field_0.i[2] >= (int)auVar74._8_4_) *
                                  tray.tnear.field_0.i[2]) <=
                          (float)((uint)(tray.tfar.field_0.i[2] < (int)uVar76) *
                                  tray.tfar.field_0.i[2] |
                                 (tray.tfar.field_0.i[2] >= (int)uVar76) * uVar76));
              auVar31._12_4_ =
                   -(uint)((float)((tray.tnear.field_0.i[3] < (int)auVar74._12_4_) * auVar74._12_4_
                                  | (uint)(tray.tnear.field_0.i[3] >= (int)auVar74._12_4_) *
                                    tray.tnear.field_0.i[3]) <=
                          (float)((uint)(tray.tfar.field_0.i[3] < (int)uVar77) *
                                  tray.tfar.field_0.i[3] |
                                 (tray.tfar.field_0.i[3] >= (int)uVar77) * uVar77));
              uVar12 = movmskps((int)valid_i,auVar31);
              valid_i = (vint<4> *)(ulong)uVar12;
              if (uVar12 == 0) {
                auVar48._4_4_ = fStack_1964;
                auVar48._0_4_ = local_1968;
                auVar48._8_4_ = fStack_1960;
                auVar48._12_4_ = fStack_195c;
                sVar15 = sVar20;
              }
              else {
                auVar47._4_4_ = fVar51;
                auVar47._0_4_ = fVar44;
                auVar47._8_4_ = fVar53;
                auVar47._12_4_ = fVar55;
                auVar48 = blendvps(auVar47,auVar74,auVar31);
                if (sVar20 != 8) {
                  pNVar25->ptr = sVar20;
                  pNVar25 = pNVar25 + 1;
                  paVar27->v[0] = local_1968;
                  paVar27->v[1] = fStack_1964;
                  paVar27->v[2] = fStack_1960;
                  paVar27->v[3] = fStack_195c;
                  paVar27 = paVar27 + 1;
                }
              }
              sVar20 = sVar15;
              local_1968 = auVar48._0_4_;
              fStack_1964 = auVar48._4_4_;
              fStack_1960 = auVar48._8_4_;
              fStack_195c = auVar48._12_4_;
            }
            if (sVar20 == 8) goto LAB_006c8316;
            auVar32._4_4_ = -(uint)(fStack_1964 < tray.tfar.field_0.v[1]);
            auVar32._0_4_ = -(uint)(local_1968 < tray.tfar.field_0.v[0]);
            auVar32._8_4_ = -(uint)(fStack_1960 < tray.tfar.field_0.v[2]);
            auVar32._12_4_ = -(uint)(fStack_195c < tray.tfar.field_0.v[3]);
            uVar13 = movmskps((int)(root.ptr & 0xfffffffffffffff0),auVar32);
            sVar15 = (ulong)(uint)POPCOUNT(uVar13);
            root.ptr = sVar20;
          } while ((byte)uVar19 < (byte)POPCOUNT(uVar13));
          pNVar25->ptr = sVar20;
          pNVar25 = pNVar25 + 1;
          paVar27->v[0] = local_1968;
          paVar27->v[1] = fStack_1964;
          paVar27->v[2] = fStack_1960;
          paVar27->v[3] = fStack_195c;
          paVar27 = paVar27 + 1;
LAB_006c8316:
          sVar15 = 4;
        }
        else {
          while (uVar22 != 0) {
            sVar15 = 0;
            if (uVar22 != 0) {
              for (; (uVar22 >> sVar15 & 1) == 0; sVar15 = sVar15 + 1) {
              }
            }
            uVar22 = uVar22 & uVar22 - 1;
            sVar16 = sVar15;
            valid_i = (vint<4> *)This;
            bVar11 = occluded1(This,bvh,root,sVar15,&pre,ray,&tray,context);
            if (bVar11) {
              terminated.field_0.i[sVar15] = -1;
            }
          }
          iVar17 = movmskps((int)sVar16,(undefined1  [16])terminated.field_0);
          sVar15 = 3;
          fVar44 = INFINITY;
          fVar51 = INFINITY;
          fVar53 = INFINITY;
          fVar55 = INFINITY;
          local_1968 = vVar10.field_0._0_4_;
          fStack_1964 = vVar10.field_0._4_4_;
          fStack_1960 = vVar10.field_0._8_4_;
          fStack_195c = vVar10.field_0._12_4_;
          if (iVar17 != 0xf) {
            tray.tfar.field_0 =
                 (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                 blendvps((undefined1  [16])tray.tfar.field_0,_DAT_01f45a40,
                          (undefined1  [16])terminated.field_0);
            sVar15 = 2;
          }
          sVar16 = uVar14;
          if (uVar19 < uVar14) goto LAB_006c8180;
        }
        paVar26 = paVar27;
      } while ((int)sVar15 != 3);
LAB_006c8bb2:
      auVar39._0_4_ = uVar43 & terminated.field_0.i[0];
      auVar39._4_4_ = uVar50 & terminated.field_0.i[1];
      auVar39._8_4_ = auVar46._8_4_ & terminated.field_0.i[2];
      auVar39._12_4_ = auVar46._12_4_ & terminated.field_0.i[3];
      auVar62 = blendvps(*(undefined1 (*) [16])(ray + 0x80),_DAT_01f45a40,auVar39);
      *(undefined1 (*) [16])(ray + 0x80) = auVar62;
    }
  }
  return;
LAB_006c83fa:
  do {
    lVar21 = -0x10;
    if (sVar16 == sVar15) break;
    uVar12 = local_1918._0_4_;
    uVar75 = local_1918._4_4_;
    uVar76 = local_1918._8_4_;
    uVar77 = local_1918._12_4_;
    do {
      if (lVar21 == 0) break;
      uVar14 = (ulong)*(uint *)(lVar23 + 0x10 + lVar21);
      valid_i = (vint<4> *)0xffffffff;
      if (uVar14 == 0xffffffff) break;
      fVar44 = *(float *)(lVar23 + -0xb0 + lVar21);
      fVar51 = *(float *)(lVar23 + -0xa0 + lVar21);
      fVar53 = *(float *)(lVar23 + -0x90 + lVar21);
      fVar55 = *(float *)(lVar23 + -0x80 + lVar21);
      fVar84 = *(float *)(lVar23 + -0x70 + lVar21);
      fVar28 = *(float *)(lVar23 + -0x60 + lVar21);
      fVar40 = *(float *)(lVar23 + -0x20 + lVar21);
      fVar42 = *(float *)(lVar23 + -0x10 + lVar21);
      fVar41 = *(float *)(lVar23 + lVar21);
      fVar64 = fVar42 - fVar51;
      fVar112 = fVar51 - fVar84;
      fVar83 = fVar41 - fVar53;
      fVar102 = fVar53 - fVar28;
      fVar107 = fVar102 * fVar64 - fVar112 * fVar83;
      fVar100 = fVar40 - fVar44;
      fVar93 = fVar44 - fVar55;
      fVar79 = fVar83 * fVar93 - fVar102 * fVar100;
      fVar101 = fVar100 * fVar112 - fVar64 * fVar93;
      local_1848 = (float)*(undefined8 *)(ray + 0x10);
      fStack_1844 = (float)((ulong)*(undefined8 *)(ray + 0x10) >> 0x20);
      fStack_1840 = (float)*(undefined8 *)(ray + 0x18);
      fStack_183c = (float)((ulong)*(undefined8 *)(ray + 0x18) >> 0x20);
      fVar59 = fVar51 - local_1848;
      fVar60 = fVar51 - fStack_1844;
      fVar61 = fVar51 - fStack_1840;
      fVar51 = fVar51 - fStack_183c;
      local_1858 = (float)*(undefined8 *)(ray + 0x20);
      fStack_1854 = (float)((ulong)*(undefined8 *)(ray + 0x20) >> 0x20);
      fStack_1850 = (float)*(undefined8 *)(ray + 0x28);
      fStack_184c = (float)((ulong)*(undefined8 *)(ray + 0x28) >> 0x20);
      fVar45 = fVar53 - local_1858;
      fVar52 = fVar53 - fStack_1854;
      fVar54 = fVar53 - fStack_1850;
      fVar53 = fVar53 - fStack_184c;
      local_1868 = (float)*(undefined8 *)(ray + 0x50);
      fStack_1864 = (float)((ulong)*(undefined8 *)(ray + 0x50) >> 0x20);
      fStack_1860 = (float)*(undefined8 *)(ray + 0x58);
      fStack_185c = (float)((ulong)*(undefined8 *)(ray + 0x58) >> 0x20);
      local_1878 = (float)*(undefined8 *)(ray + 0x60);
      fStack_1874 = (float)((ulong)*(undefined8 *)(ray + 0x60) >> 0x20);
      fStack_1870 = (float)*(undefined8 *)(ray + 0x68);
      fStack_186c = (float)((ulong)*(undefined8 *)(ray + 0x68) >> 0x20);
      fVar71 = fVar59 * local_1878 - fVar45 * local_1868;
      fVar72 = fVar60 * fStack_1874 - fVar52 * fStack_1864;
      fVar78 = fVar61 * fStack_1870 - fVar54 * fStack_1860;
      fVar82 = fVar51 * fStack_186c - fVar53 * fStack_185c;
      local_1908 = (float)*(undefined8 *)ray;
      fStack_1904 = (float)((ulong)*(undefined8 *)ray >> 0x20);
      fStack_1900 = (float)*(undefined8 *)(ray + 8);
      fStack_18fc = (float)((ulong)*(undefined8 *)(ray + 8) >> 0x20);
      fVar56 = fVar44 - local_1908;
      fVar57 = fVar44 - fStack_1904;
      fVar58 = fVar44 - fStack_1900;
      fVar44 = fVar44 - fStack_18fc;
      local_1888 = (float)*(undefined8 *)(ray + 0x40);
      fStack_1884 = (float)((ulong)*(undefined8 *)(ray + 0x40) >> 0x20);
      fStack_1880 = (float)*(undefined8 *)(ray + 0x48);
      fStack_187c = (float)((ulong)*(undefined8 *)(ray + 0x48) >> 0x20);
      fVar94 = fVar45 * local_1888 - fVar56 * local_1878;
      fVar97 = fVar52 * fStack_1884 - fVar57 * fStack_1874;
      fVar98 = fVar54 * fStack_1880 - fVar58 * fStack_1870;
      fVar99 = fVar53 * fStack_187c - fVar44 * fStack_186c;
      fVar65 = fVar56 * local_1868 - fVar59 * local_1888;
      fVar66 = fVar57 * fStack_1864 - fVar60 * fStack_1884;
      fVar67 = fVar58 * fStack_1860 - fVar61 * fStack_1880;
      fVar70 = fVar44 * fStack_185c - fVar51 * fStack_187c;
      fVar86 = fVar107 * local_1888 + local_1868 * fVar79 + fVar101 * local_1878;
      fVar88 = fVar107 * fStack_1884 + fStack_1864 * fVar79 + fVar101 * fStack_1874;
      fVar90 = fVar107 * fStack_1880 + fStack_1860 * fVar79 + fVar101 * fStack_1870;
      fVar92 = fVar107 * fStack_187c + fStack_185c * fVar79 + fVar101 * fStack_186c;
      uVar85 = (uint)fVar86 & 0x80000000;
      uVar87 = (uint)fVar88 & 0x80000000;
      uVar89 = (uint)fVar90 & 0x80000000;
      uVar91 = (uint)fVar92 & 0x80000000;
      fVar103 = (float)((uint)(fVar100 * fVar71 + fVar64 * fVar94 + fVar83 * fVar65) ^ uVar85);
      fVar104 = (float)((uint)(fVar100 * fVar72 + fVar64 * fVar97 + fVar83 * fVar66) ^ uVar87);
      fVar105 = (float)((uint)(fVar100 * fVar78 + fVar64 * fVar98 + fVar83 * fVar67) ^ uVar89);
      fVar64 = (float)((uint)(fVar100 * fVar82 + fVar64 * fVar99 + fVar83 * fVar70) ^ uVar91);
      uVar117 = -(uint)(0.0 <= fVar103) & uVar12;
      uVar118 = -(uint)(0.0 <= fVar104) & uVar75;
      uVar119 = -(uint)(0.0 <= fVar105) & uVar76;
      uVar120 = -(uint)(0.0 <= fVar64) & uVar77;
      auVar8._4_4_ = uVar118;
      auVar8._0_4_ = uVar117;
      auVar8._8_4_ = uVar119;
      auVar8._12_4_ = uVar120;
      iVar17 = movmskps(0xffffffff,auVar8);
      local_1898 = (float)*(undefined8 *)(ray + 0x30);
      fStack_1894 = (float)((ulong)*(undefined8 *)(ray + 0x30) >> 0x20);
      fStack_1890 = (float)*(undefined8 *)(ray + 0x38);
      fStack_188c = (float)((ulong)*(undefined8 *)(ray + 0x38) >> 0x20);
      local_18a8 = (float)*(undefined8 *)(ray + 0x80);
      fStack_18a4 = (float)((ulong)*(undefined8 *)(ray + 0x80) >> 0x20);
      fStack_18a0 = (float)*(undefined8 *)(ray + 0x88);
      fStack_189c = (float)((ulong)*(undefined8 *)(ray + 0x88) >> 0x20);
      local_18b8 = (uint)*(undefined8 *)(ray + 0x90);
      uStack_18b4 = (uint)((ulong)*(undefined8 *)(ray + 0x90) >> 0x20);
      uStack_18b0 = (uint)*(undefined8 *)(ray + 0x98);
      uStack_18ac = (uint)((ulong)*(undefined8 *)(ray + 0x98) >> 0x20);
      if (iVar17 != 0) {
        fVar65 = (float)((uint)(fVar93 * fVar71 + fVar112 * fVar94 + fVar102 * fVar65) ^ uVar85);
        fVar66 = (float)((uint)(fVar93 * fVar72 + fVar112 * fVar97 + fVar102 * fVar66) ^ uVar87);
        fVar67 = (float)((uint)(fVar93 * fVar78 + fVar112 * fVar98 + fVar102 * fVar67) ^ uVar89);
        fVar70 = (float)((uint)(fVar93 * fVar82 + fVar112 * fVar99 + fVar102 * fVar70) ^ uVar91);
        auVar63._0_4_ = -(uint)(0.0 <= fVar65) & uVar117;
        auVar63._4_4_ = -(uint)(0.0 <= fVar66) & uVar118;
        auVar63._8_4_ = -(uint)(0.0 <= fVar67) & uVar119;
        auVar63._12_4_ = -(uint)(0.0 <= fVar70) & uVar120;
        iVar17 = movmskps(iVar17,auVar63);
        if (iVar17 != 0) {
          fVar71 = ABS(fVar86);
          fVar72 = ABS(fVar88);
          fVar78 = ABS(fVar90);
          fVar82 = ABS(fVar92);
          auVar34._0_4_ = -(uint)(fVar65 <= fVar71 - fVar103) & auVar63._0_4_;
          auVar34._4_4_ = -(uint)(fVar66 <= fVar72 - fVar104) & auVar63._4_4_;
          auVar34._8_4_ = -(uint)(fVar67 <= fVar78 - fVar105) & auVar63._8_4_;
          auVar34._12_4_ = -(uint)(fVar70 <= fVar82 - fVar64) & auVar63._12_4_;
          iVar17 = movmskps(iVar17,auVar34);
          if (iVar17 != 0) {
            fVar45 = (float)(uVar85 ^ (uint)(fVar56 * fVar107 + fVar59 * fVar79 + fVar101 * fVar45))
            ;
            fVar52 = (float)(uVar87 ^ (uint)(fVar57 * fVar107 + fVar60 * fVar79 + fVar101 * fVar52))
            ;
            fVar54 = (float)(uVar89 ^ (uint)(fVar58 * fVar107 + fVar61 * fVar79 + fVar101 * fVar54))
            ;
            fVar44 = (float)(uVar91 ^ (uint)(fVar44 * fVar107 + fVar51 * fVar79 + fVar101 * fVar53))
            ;
            uVar85 = -(uint)(fVar45 <= fVar71 * local_18a8 && fVar71 * local_1898 < fVar45) &
                     auVar34._0_4_;
            uVar87 = -(uint)(fVar52 <= fVar72 * fStack_18a4 && fVar72 * fStack_1894 < fVar52) &
                     auVar34._4_4_;
            uVar89 = -(uint)(fVar54 <= fVar78 * fStack_18a0 && fVar78 * fStack_1890 < fVar54) &
                     auVar34._8_4_;
            uVar91 = -(uint)(fVar44 <= fVar82 * fStack_189c && fVar82 * fStack_188c < fVar44) &
                     auVar34._12_4_;
            auVar4._4_4_ = uVar87;
            auVar4._0_4_ = uVar85;
            auVar4._8_4_ = uVar89;
            auVar4._12_4_ = uVar91;
            iVar17 = movmskps(iVar17,auVar4);
            if (iVar17 != 0) {
              uVar85 = -(uint)(fVar86 != 0.0) & uVar85;
              uVar87 = -(uint)(fVar88 != 0.0) & uVar87;
              uVar89 = -(uint)(fVar90 != 0.0) & uVar89;
              uVar91 = -(uint)(fVar92 != 0.0) & uVar91;
              auVar2._4_4_ = uVar87;
              auVar2._0_4_ = uVar85;
              auVar2._8_4_ = uVar89;
              auVar2._12_4_ = uVar91;
              iVar17 = movmskps(iVar17,auVar2);
              if (iVar17 != 0) {
                pGVar1 = (context->scene->geometries).items[uVar14].ptr;
                uVar117 = pGVar1->mask;
                auVar35._0_4_ = -(uint)((uVar117 & local_18b8) == 0);
                auVar35._4_4_ = -(uint)((uVar117 & uStack_18b4) == 0);
                auVar35._8_4_ = -(uint)((uVar117 & uStack_18b0) == 0);
                auVar35._12_4_ = -(uint)((uVar117 & uStack_18ac) == 0);
                auVar36._4_4_ = uVar87;
                auVar36._0_4_ = uVar85;
                auVar36._8_4_ = uVar89;
                auVar36._12_4_ = uVar91;
                auVar36 = ~auVar35 & auVar36;
                iVar17 = movmskps((int)pGVar1,auVar36);
                if (iVar17 != 0) {
                  uVar12 = ~auVar36._0_4_ & uVar12;
                  uVar75 = ~auVar36._4_4_ & uVar75;
                  uVar76 = ~auVar36._8_4_ & uVar76;
                  uVar77 = ~auVar36._12_4_ & uVar77;
                }
              }
            }
          }
        }
      }
      auVar6._4_4_ = uVar75;
      auVar6._0_4_ = uVar12;
      auVar6._8_4_ = uVar76;
      auVar6._12_4_ = uVar77;
      uVar85 = movmskps(iVar17,auVar6);
      valid_i = (vint<4> *)(ulong)uVar85;
      if (uVar85 == 0) {
        fVar44 = INFINITY;
        fVar51 = INFINITY;
        fVar53 = INFINITY;
        fVar55 = INFINITY;
        break;
      }
      fVar44 = *(float *)(lVar23 + -0x50 + lVar21);
      fVar51 = *(float *)(lVar23 + -0x40 + lVar21);
      fVar53 = *(float *)(lVar23 + -0x30 + lVar21);
      fVar99 = fVar44 - fVar40;
      fVar100 = fVar44 - fVar40;
      fVar101 = fVar44 - fVar40;
      fVar40 = fVar44 - fVar40;
      fVar102 = fVar51 - fVar42;
      fVar104 = fVar51 - fVar42;
      fVar107 = fVar51 - fVar42;
      fVar42 = fVar51 - fVar42;
      fVar82 = fVar53 - fVar41;
      fVar79 = fVar53 - fVar41;
      fVar88 = fVar53 - fVar41;
      fVar41 = fVar53 - fVar41;
      fVar71 = fVar55 - fVar44;
      fVar72 = fVar55 - fVar44;
      fVar78 = fVar55 - fVar44;
      fVar55 = fVar55 - fVar44;
      fVar57 = fVar84 - fVar51;
      fVar58 = fVar84 - fVar51;
      fVar59 = fVar84 - fVar51;
      fVar84 = fVar84 - fVar51;
      fVar66 = fVar28 - fVar53;
      fVar67 = fVar28 - fVar53;
      fVar70 = fVar28 - fVar53;
      fVar28 = fVar28 - fVar53;
      fVar93 = fVar57 * fVar82 - fVar66 * fVar102;
      fVar94 = fVar58 * fVar79 - fVar67 * fVar104;
      fVar97 = fVar59 * fVar88 - fVar70 * fVar107;
      fVar98 = fVar84 * fVar41 - fVar28 * fVar42;
      fVar83 = fVar66 * fVar99 - fVar71 * fVar82;
      fVar86 = fVar67 * fVar100 - fVar72 * fVar79;
      fVar90 = fVar70 * fVar101 - fVar78 * fVar88;
      fVar92 = fVar28 * fVar40 - fVar55 * fVar41;
      fVar45 = fVar71 * fVar102 - fVar57 * fVar99;
      fVar52 = fVar72 * fVar104 - fVar58 * fVar100;
      fVar54 = fVar78 * fVar107 - fVar59 * fVar101;
      fVar56 = fVar55 * fVar42 - fVar84 * fVar40;
      local_1908 = fVar44 - local_1908;
      fStack_1904 = fVar44 - fStack_1904;
      fStack_1900 = fVar44 - fStack_1900;
      fVar44 = fVar44 - fStack_18fc;
      local_1848 = fVar51 - local_1848;
      fStack_1844 = fVar51 - fStack_1844;
      fStack_1840 = fVar51 - fStack_1840;
      fVar51 = fVar51 - fStack_183c;
      local_1858 = fVar53 - local_1858;
      fStack_1854 = fVar53 - fStack_1854;
      fStack_1850 = fVar53 - fStack_1850;
      fVar53 = fVar53 - fStack_184c;
      fVar103 = local_1848 * local_1878 - local_1858 * local_1868;
      fVar105 = fStack_1844 * fStack_1874 - fStack_1854 * fStack_1864;
      fVar112 = fStack_1840 * fStack_1870 - fStack_1850 * fStack_1860;
      fVar106 = fVar51 * fStack_186c - fVar53 * fStack_185c;
      fVar108 = local_1858 * local_1888 - local_1908 * local_1878;
      fVar109 = fStack_1854 * fStack_1884 - fStack_1904 * fStack_1874;
      fVar110 = fStack_1850 * fStack_1880 - fStack_1900 * fStack_1870;
      fVar111 = fVar53 * fStack_187c - fVar44 * fStack_186c;
      fVar113 = local_1908 * local_1868 - local_1848 * local_1888;
      fVar114 = fStack_1904 * fStack_1864 - fStack_1844 * fStack_1884;
      fVar115 = fStack_1900 * fStack_1860 - fStack_1840 * fStack_1880;
      fVar116 = fVar44 * fStack_185c - fVar51 * fStack_187c;
      fVar60 = fVar93 * local_1888 + local_1868 * fVar83 + fVar45 * local_1878;
      fVar61 = fVar94 * fStack_1884 + fStack_1864 * fVar86 + fVar52 * fStack_1874;
      fVar64 = fVar97 * fStack_1880 + fStack_1860 * fVar90 + fVar54 * fStack_1870;
      fVar65 = fVar98 * fStack_187c + fStack_185c * fVar92 + fVar56 * fStack_186c;
      uVar87 = (uint)fVar60 & 0x80000000;
      uVar89 = (uint)fVar61 & 0x80000000;
      uVar91 = (uint)fVar64 & 0x80000000;
      uVar117 = (uint)fVar65 & 0x80000000;
      fVar57 = (float)((uint)(fVar71 * fVar103 + fVar57 * fVar108 + fVar66 * fVar113) ^ uVar87);
      fVar58 = (float)((uint)(fVar72 * fVar105 + fVar58 * fVar109 + fVar67 * fVar114) ^ uVar89);
      fVar59 = (float)((uint)(fVar78 * fVar112 + fVar59 * fVar110 + fVar70 * fVar115) ^ uVar91);
      fVar55 = (float)((uint)(fVar55 * fVar106 + fVar84 * fVar111 + fVar28 * fVar116) ^ uVar117);
      uVar118 = -(uint)(0.0 <= fVar57) & uVar12;
      uVar119 = -(uint)(0.0 <= fVar58) & uVar75;
      uVar120 = -(uint)(0.0 <= fVar59) & uVar76;
      uVar121 = -(uint)(0.0 <= fVar55) & uVar77;
      auVar9._4_4_ = uVar119;
      auVar9._0_4_ = uVar118;
      auVar9._8_4_ = uVar120;
      auVar9._12_4_ = uVar121;
      uVar85 = movmskps(uVar85,auVar9);
      pRVar24 = (Ref<embree::Geometry> *)(ulong)uVar85;
      if (uVar85 == 0) {
LAB_006c87d0:
        uVar13 = SUB84(pRVar24,0);
      }
      else {
        fVar84 = (float)((uint)(fVar99 * fVar103 + fVar102 * fVar108 + fVar82 * fVar113) ^ uVar87);
        fVar28 = (float)((uint)(fVar100 * fVar105 + fVar104 * fVar109 + fVar79 * fVar114) ^ uVar89);
        fVar66 = (float)((uint)(fVar101 * fVar112 + fVar107 * fVar110 + fVar88 * fVar115) ^ uVar91);
        fVar40 = (float)((uint)(fVar40 * fVar106 + fVar42 * fVar111 + fVar41 * fVar116) ^ uVar117);
        uVar118 = -(uint)(0.0 <= fVar84) & uVar118;
        uVar119 = -(uint)(0.0 <= fVar28) & uVar119;
        uVar120 = -(uint)(0.0 <= fVar66) & uVar120;
        uVar121 = -(uint)(0.0 <= fVar40) & uVar121;
        auVar5._4_4_ = uVar119;
        auVar5._0_4_ = uVar118;
        auVar5._8_4_ = uVar120;
        auVar5._12_4_ = uVar121;
        uVar85 = movmskps(uVar85,auVar5);
        pRVar24 = (Ref<embree::Geometry> *)(ulong)uVar85;
        if (uVar85 == 0) goto LAB_006c87d0;
        fVar42 = ABS(fVar60);
        fVar41 = ABS(fVar61);
        fVar67 = ABS(fVar64);
        fVar70 = ABS(fVar65);
        auVar69._0_4_ = -(uint)(fVar84 <= fVar42 - fVar57) & uVar118;
        auVar69._4_4_ = -(uint)(fVar28 <= fVar41 - fVar58) & uVar119;
        auVar69._8_4_ = -(uint)(fVar66 <= fVar67 - fVar59) & uVar120;
        auVar69._12_4_ = -(uint)(fVar40 <= fVar70 - fVar55) & uVar121;
        uVar85 = movmskps(uVar85,auVar69);
        pRVar24 = (Ref<embree::Geometry> *)(ulong)uVar85;
        if (uVar85 == 0) goto LAB_006c87d0;
        fVar55 = (float)(uVar87 ^ (uint)(local_1908 * fVar93 +
                                        local_1848 * fVar83 + fVar45 * local_1858));
        fVar84 = (float)(uVar89 ^ (uint)(fStack_1904 * fVar94 +
                                        fStack_1844 * fVar86 + fVar52 * fStack_1854));
        fVar28 = (float)(uVar91 ^ (uint)(fStack_1900 * fVar97 +
                                        fStack_1840 * fVar90 + fVar54 * fStack_1850));
        fVar44 = (float)(uVar117 ^ (uint)(fVar44 * fVar98 + fVar51 * fVar92 + fVar56 * fVar53));
        uVar87 = -(uint)(fVar55 <= fVar42 * local_18a8 && fVar42 * local_1898 < fVar55) &
                 auVar69._0_4_;
        uVar89 = -(uint)(fVar84 <= fVar41 * fStack_18a4 && fVar41 * fStack_1894 < fVar84) &
                 auVar69._4_4_;
        uVar91 = -(uint)(fVar28 <= fVar67 * fStack_18a0 && fVar67 * fStack_1890 < fVar28) &
                 auVar69._8_4_;
        uVar117 = -(uint)(fVar44 <= fVar70 * fStack_189c && fVar70 * fStack_188c < fVar44) &
                  auVar69._12_4_;
        auVar3._4_4_ = uVar89;
        auVar3._0_4_ = uVar87;
        auVar3._8_4_ = uVar91;
        auVar3._12_4_ = uVar117;
        uVar85 = movmskps(uVar85,auVar3);
        pRVar24 = (Ref<embree::Geometry> *)(ulong)uVar85;
        if (uVar85 != 0) {
          auVar38._0_4_ = -(uint)(fVar60 != 0.0) & uVar87;
          auVar38._4_4_ = -(uint)(fVar61 != 0.0) & uVar89;
          auVar38._8_4_ = -(uint)(fVar64 != 0.0) & uVar91;
          auVar38._12_4_ = -(uint)(fVar65 != 0.0) & uVar117;
          uVar85 = movmskps(uVar85,auVar38);
          pRVar24 = (Ref<embree::Geometry> *)(ulong)uVar85;
          if (uVar85 != 0) {
            pRVar24 = (context->scene->geometries).items;
            uVar85 = (pRVar24[uVar14].ptr)->mask;
            auVar37._0_4_ = -(uint)((uVar85 & local_18b8) == 0);
            auVar37._4_4_ = -(uint)((uVar85 & uStack_18b4) == 0);
            auVar37._8_4_ = -(uint)((uVar85 & uStack_18b0) == 0);
            auVar37._12_4_ = -(uint)((uVar85 & uStack_18ac) == 0);
            auVar38 = ~auVar37 & auVar38;
            iVar17 = movmskps((int)pRVar24[uVar14].ptr,auVar38);
            if (iVar17 != 0) {
              uVar12 = ~auVar38._0_4_ & uVar12;
              uVar75 = ~auVar38._4_4_ & uVar75;
              uVar76 = ~auVar38._8_4_ & uVar76;
              uVar77 = ~auVar38._12_4_ & uVar77;
              goto LAB_006c87d0;
            }
          }
        }
        uVar13 = SUB84(pRVar24,0);
      }
      fVar55 = INFINITY;
      fVar53 = INFINITY;
      fVar51 = INFINITY;
      fVar44 = INFINITY;
      auVar7._4_4_ = uVar75;
      auVar7._0_4_ = uVar12;
      auVar7._8_4_ = uVar76;
      auVar7._12_4_ = uVar77;
      uVar85 = movmskps(uVar13,auVar7);
      valid_i = (vint<4> *)(ulong)uVar85;
      lVar21 = lVar21 + 4;
    } while (uVar85 != 0);
    local_1918._0_4_ = local_1918._0_4_ & uVar12;
    local_1918._4_4_ = local_1918._4_4_ & uVar75;
    local_1918._8_4_ = local_1918._8_4_ & uVar76;
    local_1918._12_4_ = local_1918._12_4_ & uVar77;
    iVar17 = movmskps((int)lVar21,local_1918);
    sVar16 = sVar16 + 1;
    lVar23 = lVar23 + 0xe0;
  } while (iVar17 != 0);
  auVar49._0_8_ = local_1918._0_8_ ^ 0xffffffffffffffff;
  auVar49._8_4_ = local_1918._8_4_ ^ 0xffffffff;
  auVar49._12_4_ = local_1918._12_4_ ^ 0xffffffff;
  terminated.field_0 =
       (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)
       ((undefined1  [16])terminated.field_0 | auVar49);
  uVar12 = movmskps((int)sVar15,(undefined1  [16])terminated.field_0);
  sVar15 = (size_t)uVar12;
  if (uVar12 == 0xf) goto LAB_006c8bb2;
  tray.tfar.field_0 =
       (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
       blendvps((undefined1  [16])tray.tfar.field_0,_DAT_01f45a40,
                (undefined1  [16])terminated.field_0);
  goto LAB_006c813c;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }